

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::EncodeInternal(ObjEncoder *this)

{
  bool bVar1;
  
  this->sub_obj_att_ = (PointAttribute *)0x0;
  this->added_edges_att_ = (PointAttribute *)0x0;
  this->normal_att_ = (PointAttribute *)0x0;
  this->material_att_ = (PointAttribute *)0x0;
  this->pos_att_ = (PointAttribute *)0x0;
  this->tex_coord_att_ = (PointAttribute *)0x0;
  this->current_sub_obj_id_ = -1;
  this->current_material_id_ = -1;
  bVar1 = GetSubObjects(this);
  if (((bVar1) &&
      (((this->in_mesh_ == (Mesh *)0x0 || (bVar1 = GetAddedEdges(this), bVar1)) &&
       (bVar1 = EncodeMaterialFileName(this), bVar1)))) &&
     (((bVar1 = EncodePositions(this), bVar1 && (bVar1 = EncodeTextureCoordinates(this), bVar1)) &&
      (bVar1 = EncodeNormals(this), bVar1)))) {
    if (this->in_mesh_ == (Mesh *)0x0) {
      return true;
    }
    EncodeFaces(this);
    return true;
  }
  return false;
}

Assistant:

bool ObjEncoder::EncodeInternal() {
  pos_att_ = nullptr;
  tex_coord_att_ = nullptr;
  normal_att_ = nullptr;
  material_att_ = nullptr;
  sub_obj_att_ = nullptr;
  added_edges_att_ = nullptr;
  current_sub_obj_id_ = -1;
  current_material_id_ = -1;
  if (!GetSubObjects()) {
    return false;
  }
  if (in_mesh_ && !GetAddedEdges()) {
    return false;
  }
  if (!EncodeMaterialFileName()) {
    return false;
  }
  if (!EncodePositions()) {
    return false;
  }
  if (!EncodeTextureCoordinates()) {
    return false;
  }
  if (!EncodeNormals()) {
    return false;
  }
  if (in_mesh_ && !EncodeFaces()) {
    return false;
  }
  return true;
}